

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

int set_system_properties(IOTHUB_MESSAGE_LIST *message,HTTP_HEADERS_HANDLE headers)

{
  _Bool _Var1;
  HTTP_HEADERS_RESULT HVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *contentEncoding;
  char *content_type;
  char *corrId;
  char *msgId;
  int result;
  HTTP_HEADERS_HANDLE headers_local;
  IOTHUB_MESSAGE_LIST *message_local;
  
  pcVar3 = IoTHubMessage_GetMessageId(message->messageHandle);
  if ((pcVar3 == (char *)0x0) ||
     (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair(headers,IOTHUB_MESSAGE_ID,pcVar3),
     HVar2 == HTTP_HEADERS_OK)) {
    pcVar3 = IoTHubMessage_GetCorrelationId(message->messageHandle);
    if ((pcVar3 == (char *)0x0) ||
       (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair(headers,IOTHUB_CORRELATION_ID,pcVar3),
       HVar2 == HTTP_HEADERS_OK)) {
      pcVar3 = IoTHubMessage_GetContentTypeSystemProperty(message->messageHandle);
      if ((pcVar3 == (char *)0x0) ||
         (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair(headers,IOTHUB_CONTENT_TYPE_D2C,pcVar3),
         HVar2 == HTTP_HEADERS_OK)) {
        pcVar3 = IoTHubMessage_GetContentEncodingSystemProperty(message->messageHandle);
        if ((pcVar3 == (char *)0x0) ||
           (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair
                              (headers,IOTHUB_CONTENT_ENCODING_D2C,pcVar3), HVar2 == HTTP_HEADERS_OK
           )) {
          _Var1 = IoTHubMessage_IsSecurityMessage(message->messageHandle);
          if ((_Var1) &&
             (HVar2 = HTTPHeaders_ReplaceHeaderNameValuePair
                                (headers,"iothub-interface-id",
                                 "urn:azureiot:Security:SecurityAgent:1"), HVar2 != HTTP_HEADERS_OK)
             ) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                        ,"set_system_properties",0x112,1,
                        "unable to set security message header info");
            }
            msgId._4_4_ = 0x113;
          }
          else {
            msgId._4_4_ = 0;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"set_system_properties",0x10d,1,
                      "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-encoding)");
          }
          msgId._4_4_ = 0x10e;
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"set_system_properties",0x108,1,
                    "unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-type)");
        }
        msgId._4_4_ = 0x109;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                  ,"set_system_properties",0x103,1,
                  "unable to HTTPHeaders_ReplaceHeaderNameValuePair");
      }
      msgId._4_4_ = 0x104;
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"set_system_properties",0xfe,1,"unable to HTTPHeaders_ReplaceHeaderNameValuePair");
    }
    msgId._4_4_ = 0xff;
  }
  return msgId._4_4_;
}

Assistant:

static int set_system_properties(IOTHUB_MESSAGE_LIST* message, HTTP_HEADERS_HANDLE headers)
{
    int result;
    const char* msgId;
    const char* corrId;
    const char* content_type;
    const char* contentEncoding;

    // Add the Message Id and the Correlation Id
    msgId = IoTHubMessage_GetMessageId(message->messageHandle);
    if (msgId != NULL && HTTPHeaders_ReplaceHeaderNameValuePair(headers, IOTHUB_MESSAGE_ID, msgId) != HTTP_HEADERS_OK)
    {
        LogError("unable to HTTPHeaders_ReplaceHeaderNameValuePair");
        result = MU_FAILURE;
    }
    else if ((corrId = IoTHubMessage_GetCorrelationId(message->messageHandle)) != NULL && HTTPHeaders_ReplaceHeaderNameValuePair(headers, IOTHUB_CORRELATION_ID, corrId) != HTTP_HEADERS_OK)
    {
        LogError("unable to HTTPHeaders_ReplaceHeaderNameValuePair");
        result = MU_FAILURE;
    }
    else if ((content_type = IoTHubMessage_GetContentTypeSystemProperty(message->messageHandle)) != NULL && HTTPHeaders_ReplaceHeaderNameValuePair(headers, IOTHUB_CONTENT_TYPE_D2C, content_type) != HTTP_HEADERS_OK)
    {
        LogError("unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-type)");
        result = MU_FAILURE;
    }
    else if ((contentEncoding = IoTHubMessage_GetContentEncodingSystemProperty(message->messageHandle)) != NULL && HTTPHeaders_ReplaceHeaderNameValuePair(headers, IOTHUB_CONTENT_ENCODING_D2C, contentEncoding) != HTTP_HEADERS_OK)
    {
        LogError("unable to HTTPHeaders_ReplaceHeaderNameValuePair (content-encoding)");
        result = MU_FAILURE;
    }
    else if (IoTHubMessage_IsSecurityMessage(message->messageHandle) && HTTPHeaders_ReplaceHeaderNameValuePair(headers, SECURITY_INTERFACE_ID, SECURITY_INTERFACE_ID_VALUE) != HTTP_HEADERS_OK)
    {
        LogError("unable to set security message header info");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    return result;
}